

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTabBar(char *str_id,ImGuiTabBarFlags flags)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiContext_conflict1 *pIVar2;
  bool bVar3;
  ImGuiID key;
  ImGuiTabBar *tab_bar;
  ImRect local_30;
  
  pIVar2 = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    key = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    tab_bar = ImPool<ImGuiTabBar>::GetOrAddByKey(&pIVar2->TabBars,key);
    local_30.Max.x = (this->WorkRect).Max.x;
    fVar1 = (pIVar2->Style).FramePadding.y;
    local_30.Min = (this->DC).CursorPos;
    local_30.Max.y = fVar1 + fVar1 + local_30.Min.y + pIVar2->FontSize;
    tab_bar->ID = key;
    bVar3 = BeginTabBarEx(tab_bar,&local_30,flags | 0x200000,(ImGuiDockNode *)0x0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool    ImGui::BeginTabBar(const char* str_id, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiID id = window->GetID(str_id);
    ImGuiTabBar* tab_bar = g.TabBars.GetOrAddByKey(id);
    ImRect tab_bar_bb = ImRect(window->DC.CursorPos.x, window->DC.CursorPos.y, window->WorkRect.Max.x, window->DC.CursorPos.y + g.FontSize + g.Style.FramePadding.y * 2);
    tab_bar->ID = id;
    return BeginTabBarEx(tab_bar, tab_bar_bb, flags | ImGuiTabBarFlags_IsFocused, NULL);
}